

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_block_read_simple(BigBlock *bb,ptrdiff_t start,ptrdiff_t size,BigArray *array,char *dtype)

{
  int iVar1;
  BigArray *local_68;
  size_t dims [2];
  void *buffer;
  BigBlockPtr ptr;
  char *dtype_local;
  BigArray *array_local;
  ptrdiff_t size_local;
  ptrdiff_t start_local;
  BigBlock *bb_local;
  
  ptr.aoffset = (ptrdiff_t)dtype;
  memset(&buffer,0,0x18);
  if (ptr.aoffset == 0) {
    ptr.aoffset = (ptrdiff_t)bb;
  }
  iVar1 = big_block_seek(bb,(BigBlockPtr *)&buffer,start);
  if (iVar1 == 0) {
    array_local = (BigArray *)size;
    if (bb->size < (ulong)(start + size)) {
      array_local = (BigArray *)(bb->size - start);
    }
    if ((long)array_local < 0) {
      _big_file_raise("failed to seek",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x309);
    }
    else {
      iVar1 = big_file_dtype_itemsize((char *)ptr.aoffset);
      dims[1] = (size_t)malloc((long)array_local * (long)iVar1 * (long)bb->nmemb);
      local_68 = array_local;
      dims[0] = (size_t)bb->nmemb;
      big_array_init(array,(void *)dims[1],(char *)ptr.aoffset,2,(size_t *)&local_68,
                     (ptrdiff_t *)0x0);
      iVar1 = big_block_read(bb,(BigBlockPtr *)&buffer,array);
      if (iVar1 == 0) {
        return 0;
      }
      _big_file_raise("failed to read",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x314);
      free((void *)dims[1]);
      array->data = (void *)0x0;
    }
  }
  else {
    _big_file_raise("failed to seek",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x302);
  }
  return -1;
}

Assistant:

int
big_block_read_simple(BigBlock * bb, ptrdiff_t start, ptrdiff_t size, BigArray * array, const char * dtype)
{
    BigBlockPtr ptr = {0};
    if(dtype == NULL) {
        dtype = bb->dtype;
    }
    void * buffer;
    size_t dims[2];

    RAISEIF(0 != big_block_seek(bb, &ptr, start),
       ex_seek,
       "failed to seek"       
    );

    if(start + size > bb->size){
        size = bb->size - start;
    }
    RAISEIF(size < 0,
            ex_seek,
            "failed to seek");

    buffer = malloc(size * big_file_dtype_itemsize(dtype) * bb->nmemb);

    dims[0] = size;
    dims[1] = bb->nmemb;

    big_array_init(array, buffer, dtype, 2, dims, NULL);

    RAISEIF(0 != big_block_read(bb, &ptr, array),
            ex_read,
            "failed to read");
    return 0;
ex_read:
    free(buffer);
    array->data = NULL;
ex_seek:
    return -1;
}